

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O1

string * __thiscall
irr::scene::CB3DMeshFileLoader::readString_abi_cxx11_
          (string *__return_storage_ptr__,CB3DMeshFileLoader *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  c8 character;
  char local_19;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  iVar1 = (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&local_19,1);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    do {
      if (local_19 == '\0') {
        return __return_storage_ptr__;
      }
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      iVar1 = (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&local_19,1);
    } while (CONCAT44(extraout_var_00,iVar1) != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CB3DMeshFileLoader::readString()
{
	std::string newstring = "";
	while (true) {
		c8 character;
		if (B3DFile->read(&character, sizeof(character)) == 0)
			break; // eof
		if (character == 0)
			break;
		newstring.push_back(character);
	}
	return newstring;
}